

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

sexp_conflict
make_opcode_procedure(sexp_conflict ctx,sexp_conflict op,sexp_uint_t i,sexp_sint_t flags)

{
  sexp psVar1;
  sexp_conflict psVar2;
  undefined8 ctx_00;
  sexp value;
  sexp psVar3;
  uint in_ECX;
  int in_EDX;
  sexp_proc1 in_RSI;
  sexp_proc2 in_RDI;
  sexp_gc_var_t __sexp_gc_preserver6;
  sexp_conflict ctx2;
  sexp_gc_var_t __sexp_gc_preserver5;
  sexp_conflict lambda;
  sexp_gc_var_t __sexp_gc_preserver4;
  sexp_conflict refs;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_conflict ref;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict params;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict bc;
  sexp_conflict env;
  sexp_conflict res;
  sexp_conflict ls;
  int j;
  sexp in_stack_ffffffffffffff08;
  sexp in_stack_ffffffffffffff10;
  sexp in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  undefined1 uVar4;
  sexp ctx_01;
  sexp psVar5;
  undefined8 vars;
  undefined1 local_a8 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined4 local_2c;
  undefined8 local_18;
  undefined8 local_10;
  
  local_2c = in_EDX + (in_ECX & 1);
  local_50 = &DAT_0000043e;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&stack0xffffffffffffffa0,0,0x10);
  memset(&stack0xffffffffffffff88,0,0x10);
  uVar7 = &DAT_0000043e;
  memset(&stack0xffffffffffffff70,0,0x10);
  memset(local_a8,0,0x10);
  memset(&stack0xffffffffffffff40,0,0x10);
  memset(&stack0xffffffffffffff28,0,0x10);
  if (local_2c == (uint)(byte)*(code *)(local_18 + 0x62)) {
    if (*(long *)(local_18 + 0x20) != 0) {
      return *(sexp_conflict *)(local_18 + 0x20);
    }
  }
  else {
    if ((int)local_2c < (int)(uint)(byte)*(code *)(local_18 + 0x62)) {
      psVar1 = sexp_compile_error((sexp)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
                                  (sexp)uVar7);
      return psVar1;
    }
    if (((byte)*(code *)(local_18 + 99) & 1) == 0) {
      psVar1 = sexp_compile_error((sexp)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
                                  (sexp)uVar7);
      return psVar1;
    }
  }
  local_60 = &stack0xffffffffffffffb0;
  local_58 = *(undefined8 *)(local_10 + 0x6080);
  *(undefined8 **)(local_10 + 0x6080) = &stack0xffffffffffffffa0;
  *(undefined1 **)(local_10 + 0x6080) = &stack0xffffffffffffff88;
  uVar7 = &stack0xffffffffffffff80;
  *(undefined1 **)(local_10 + 0x6080) = &stack0xffffffffffffff70;
  local_a8._0_8_ = &stack0xffffffffffffff68;
  local_a8._8_8_ = *(undefined8 *)(local_10 + 0x6080);
  *(undefined1 **)(local_10 + 0x6080) = local_a8;
  vars = &stack0xffffffffffffff50;
  uVar6 = *(undefined8 *)(local_10 + 0x6080);
  *(undefined1 **)(local_10 + 0x6080) = &stack0xffffffffffffff40;
  psVar1 = (sexp)&stack0xffffffffffffff38;
  ctx_01 = *(sexp *)(local_10 + 0x6080);
  *(undefined1 **)(local_10 + 0x6080) = &stack0xffffffffffffff28;
  psVar2 = make_param_list((sexp_conflict)
                           CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                           (sexp_uint_t)in_stack_ffffffffffffff18);
  ctx_00 = sexp_make_lambda(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  value = sexp_make_child_context(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  local_48 = sexp_extend_env((sexp)ctx_00,(sexp)uVar6,(sexp)vars,value);
  if (((local_48 & 3) != 0) || (local_40 = local_48, ((sexp)local_48)->tag != 0x13)) {
    (value->value).type.cpl = (sexp)local_48;
    uVar6 = &DAT_0000023e;
    local_38 = psVar2;
    while( true ) {
      uVar4 = false;
      if ((local_38 & 3) == 0) {
        uVar4 = ((sexp)local_38)->tag == 6;
      }
      if ((bool)uVar4 == false) break;
      in_stack_ffffffffffffff18 = (((sexp)local_38)->value).type.name;
      psVar5 = value;
      sexp_env_cell((sexp)CONCAT17(uVar4,in_stack_ffffffffffffff20),in_stack_ffffffffffffff18,value,
                    (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
      psVar3 = sexp_make_ref((sexp)CONCAT17(uVar4,in_stack_ffffffffffffff20),
                             in_stack_ffffffffffffff18,value);
      if ((((ulong)psVar3 & 3) != 0) || (psVar3->tag != 0x13)) {
        sexp_push_op(in_stack_ffffffffffffff18,(sexp_conflict *)value,in_stack_ffffffffffffff08);
      }
      local_38 = (((sexp)local_38)->value).type.cpl;
      in_stack_ffffffffffffff10 = value;
      value = psVar5;
    }
    if (((uVar6 & 3) != 0) || (((sexp)uVar6)->tag != 0x13)) {
      sexp_reverse_op((sexp)vars,value,(sexp_sint_t)ctx_01,psVar1);
    }
    local_40 = sexp_cons_op(psVar1,(sexp)CONCAT17(uVar4,in_stack_ffffffffffffff20),
                            (sexp_sint_t)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                            in_stack_ffffffffffffff08);
    if (((local_40 & 3) != 0) || (((sexp)local_40)->tag != 0x13)) {
      generate_opcode_app((sexp_conflict)uVar7,(sexp_conflict)local_40);
      local_50 = sexp_complete_bytecode(in_stack_ffffffffffffff08);
      (((sexp)local_50)->value).flonum = *(double *)(local_18 + 8);
      local_40 = sexp_make_procedure_op
                           (ctx_01,psVar1,CONCAT17(uVar4,in_stack_ffffffffffffff20),
                            in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,(sexp)&DAT_0000043e,
                            (sexp)vars);
      if (local_2c == (uint)(byte)*(code *)(local_18 + 0x62)) {
        *(undefined8 *)(local_18 + 0x20) = local_40;
      }
    }
  }
  *(undefined8 *)(local_10 + 0x6080) = local_58;
  return (sexp_conflict)local_40;
}

Assistant:

static sexp make_opcode_procedure (sexp ctx, sexp op, sexp_uint_t i, sexp_sint_t flags) {
  int j = i+(flags & SEXP_PROC_VARIADIC);
  sexp ls, res, env;
  sexp_gc_var6(bc, params, ref, refs, lambda, ctx2);
  if (j == sexp_opcode_num_args(op)) { /* return before preserving */
    if (sexp_opcode_proc(op)) return sexp_opcode_proc(op);
  } else if (j < sexp_opcode_num_args(op)) {
    return sexp_compile_error(ctx, "not enough args for opcode", op);
  } else if (! sexp_opcode_variadic_p(op)) { /* i > num_args */
    return sexp_compile_error(ctx, "too many args for opcode", op);
  }
  sexp_gc_preserve6(ctx, bc, params, ref, refs, lambda, ctx2);
  params = make_param_list(ctx, j);
  lambda = sexp_make_lambda(ctx, params);
  ctx2 = sexp_make_child_context(ctx, lambda);
  env = sexp_extend_env(ctx2, sexp_context_env(ctx), params, lambda);
  if (sexp_exceptionp(env)) {
    res = env;
  } else {
    sexp_context_env(ctx2) = env;
    for (ls=params, refs=SEXP_NULL; sexp_pairp(ls); ls=sexp_cdr(ls)) {
      ref = sexp_make_ref(ctx2, sexp_car(ls), sexp_env_cell(ctx, env, sexp_car(ls), 0));
      if (!sexp_exceptionp(ref)) sexp_push(ctx2, refs, ref);
    }
    if (!sexp_exceptionp(refs))
      refs = sexp_reverse(ctx2, refs);
    refs = sexp_cons(ctx2, op, refs);
    if (sexp_exceptionp(refs)) {
      res = refs;
    } else {
      generate_opcode_app(ctx2, refs);
      bc = sexp_complete_bytecode(ctx2);
      sexp_bytecode_name(bc) = sexp_opcode_name(op);
      res=sexp_make_procedure(ctx2, sexp_make_fixnum(flags), sexp_make_fixnum(i), bc, SEXP_VOID);
      if (j == sexp_opcode_num_args(op))
        sexp_opcode_proc(op) = res;
    }
  }
  sexp_gc_release6(ctx);
  return res;
}